

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsonProcessingFunctions.cpp
# Opt level: O3

string_view helics::fileops::removeSpaceAndComment(string_view jsonString)

{
  ulong uVar1;
  void *pvVar2;
  long lVar3;
  char *in_RCX;
  size_t sVar4;
  char *in_RSI;
  ulong in_RDI;
  size_type __n;
  string_view sVar5;
  string_view trimCharacters;
  string_view trimCharacters_00;
  string_view trimCharacters_01;
  ulong local_38;
  char *local_30;
  
  trimCharacters._M_str = in_RCX;
  trimCharacters._M_len = (size_t)" \t\n\r";
  local_38 = in_RDI;
  local_30 = in_RSI;
  gmlc::utilities::string_viewOps::trimString
            ((string_viewOps *)&local_38,(string_view *)0x4,trimCharacters);
  if (2 < local_38) {
    sVar4 = 0;
    do {
      trimCharacters_00._M_str = local_30;
      uVar1 = local_38;
      if ((*local_30 != '/') || (local_30[1] != '/')) break;
      pvVar2 = memchr(local_30,10,local_38);
      if (pvVar2 == (void *)0x0) {
        local_30 = (char *)0x0;
        goto LAB_0034cab3;
      }
      lVar3 = (long)pvVar2 - (long)trimCharacters_00._M_str;
      local_30 = (char *)0x0;
      if (lVar3 == -1) goto LAB_0034cab3;
      trimCharacters_00._M_str = trimCharacters_00._M_str + lVar3 + 1;
      local_38 = uVar1 - (lVar3 + 1);
      trimCharacters_00._M_len = (size_t)" \t\n\r";
      local_30 = trimCharacters_00._M_str;
      gmlc::utilities::string_viewOps::trimString
                ((string_viewOps *)&local_38,(string_view *)0x4,trimCharacters_00);
      in_RCX = trimCharacters_00._M_str;
    } while (2 < local_38);
  }
  trimCharacters_01._M_str = in_RCX;
  trimCharacters_01._M_len = (size_t)" \t\n\r";
  gmlc::utilities::string_viewOps::trimString
            ((string_viewOps *)&local_38,(string_view *)0x4,trimCharacters_01);
  sVar4 = local_38;
LAB_0034cab3:
  sVar5._M_str = local_30;
  sVar5._M_len = sVar4;
  return sVar5;
}

Assistant:

static std::string_view removeSpaceAndComment(std::string_view jsonString)
{
    gmlc::utilities::string_viewOps::trimString(jsonString);
    while (jsonString.size() > 2) {
        if (jsonString[0] == '/' && jsonString[1] == '/') {
            auto nextNewLine = jsonString.find_first_of('\n');
            if (nextNewLine == std::string_view::npos) {
                return {};
            }
            jsonString.remove_prefix(nextNewLine + 1);
            gmlc::utilities::string_viewOps::trimString(jsonString);
        } else {
            break;
        }
    }
    gmlc::utilities::string_viewOps::trimString(jsonString);
    return jsonString;
}